

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O0

int Abc_NtkSecFraig(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nSeconds,int nFrames,int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pMiter_00;
  int *piVar2;
  Abc_Ntk_t *pMiter_01;
  Fraig_Man_t *p;
  int RetValue;
  Abc_Ntk_t *pFrames;
  Abc_Ntk_t *pMiter;
  Fraig_Man_t *pMan;
  Fraig_Params_t Params;
  int fVerbose_local;
  int nFrames_local;
  int nSeconds_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  Params.nInspLimit._4_4_ = fVerbose;
  pMiter_00 = Abc_NtkMiter(pNtk1,pNtk2,0,0,0,0);
  if (pMiter_00 == (Abc_Ntk_t *)0x0) {
    printf("Miter computation has failed.\n");
    pNtk1_local._4_4_ = 0;
  }
  else {
    iVar1 = Abc_NtkMiterIsConstant(pMiter_00);
    if (iVar1 == 0) {
      printf("Networks are NOT EQUIVALENT after structural hashing.\n");
      piVar2 = Abc_NtkVerifyGetCleanModel(pMiter_00,nFrames);
      pMiter_00->pModel = piVar2;
      Abc_NtkVerifyReportErrorSeq(pNtk1,pNtk2,pMiter_00->pModel,nFrames);
      if (pMiter_00->pModel != (int *)0x0) {
        free(pMiter_00->pModel);
        pMiter_00->pModel = (int *)0x0;
      }
      Abc_NtkDelete(pMiter_00);
      pNtk1_local._4_4_ = 0;
    }
    else if (iVar1 == 1) {
      Abc_NtkDelete(pMiter_00);
      printf("Networks are equivalent after structural hashing.\n");
      pNtk1_local._4_4_ = 1;
    }
    else {
      pMiter_01 = Abc_NtkFrames(pMiter_00,nFrames,1,0);
      Abc_NtkDelete(pMiter_00);
      if (pMiter_01 == (Abc_Ntk_t *)0x0) {
        printf("Frames computation has failed.\n");
        pNtk1_local._4_4_ = 0;
      }
      else {
        iVar1 = Abc_NtkMiterIsConstant(pMiter_01);
        if (iVar1 == 0) {
          printf("Networks are NOT EQUIVALENT after framing.\n");
          piVar2 = Abc_NtkVerifyGetCleanModel(pMiter_01,1);
          pMiter_01->pModel = piVar2;
          if (pMiter_01->pModel != (int *)0x0) {
            free(pMiter_01->pModel);
            pMiter_01->pModel = (int *)0x0;
          }
          Abc_NtkDelete(pMiter_01);
          pNtk1_local._4_4_ = 0;
        }
        else if (iVar1 == 1) {
          Abc_NtkDelete(pMiter_01);
          printf("Networks are equivalent after framing.\n");
          pNtk1_local._4_4_ = 1;
        }
        else {
          Fraig_ParamsSetDefault((Fraig_Params_t *)&pMan);
          Params.fChoicing = Params.nInspLimit._4_4_;
          Params.nPatsDyna = nSeconds;
          p = (Fraig_Man_t *)Abc_NtkToFraig(pMiter_01,&pMan,0,0);
          Fraig_ManProveMiter(p);
          iVar1 = Fraig_ManCheckMiter(p);
          if (iVar1 == -1) {
            printf("Networks are undecided (SAT solver timed out on the final miter).\n");
          }
          else if (iVar1 == 1) {
            printf("Networks are equivalent after fraiging.\n");
          }
          else {
            if (iVar1 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcVerify.c"
                            ,0x28d,"int Abc_NtkSecFraig(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int)");
            }
            printf("Networks are NOT EQUIVALENT after fraiging.\n");
          }
          Fraig_ManFree(p);
          Abc_NtkDelete(pMiter_01);
          pNtk1_local._4_4_ = (uint)(iVar1 == 1);
        }
      }
    }
  }
  return pNtk1_local._4_4_;
}

Assistant:

int Abc_NtkSecFraig( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int nFrames, int fVerbose )
{
    Fraig_Params_t Params;
    Fraig_Man_t * pMan;
    Abc_Ntk_t * pMiter;
    Abc_Ntk_t * pFrames;
    int RetValue;

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 0, 0, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return 0;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, nFrames );
        Abc_NtkVerifyReportErrorSeq( pNtk1, pNtk2, pMiter->pModel, nFrames );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return 0;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pMiter );
        printf( "Networks are equivalent after structural hashing.\n" );
        return 1;
    }

    // create the timeframes
    pFrames = Abc_NtkFrames( pMiter, nFrames, 1, 0 );
    Abc_NtkDelete( pMiter );
    if ( pFrames == NULL )
    {
        printf( "Frames computation has failed.\n" );
        return 0;
    }
    RetValue = Abc_NtkMiterIsConstant( pFrames );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after framing.\n" );
        // report the error
        pFrames->pModel = Abc_NtkVerifyGetCleanModel( pFrames, 1 );
//        Abc_NtkVerifyReportErrorSeq( pNtk1, pNtk2, pFrames->pModel, nFrames );
        ABC_FREE( pFrames->pModel );
        Abc_NtkDelete( pFrames );
        return 0;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pFrames );
        printf( "Networks are equivalent after framing.\n" );
        return 1;
    }

    // convert the miter into a FRAIG
    Fraig_ParamsSetDefault( &Params );
    Params.fVerbose = fVerbose;
    Params.nSeconds = nSeconds;
//    Params.fFuncRed = 0;
//    Params.nPatsRand = 0;
//    Params.nPatsDyna = 0;
    pMan = (Fraig_Man_t *)Abc_NtkToFraig( pFrames, &Params, 0, 0 ); 
    Fraig_ManProveMiter( pMan );

    // analyze the result
    RetValue = Fraig_ManCheckMiter( pMan );
    // report the result
    if ( RetValue == -1 )
        printf( "Networks are undecided (SAT solver timed out on the final miter).\n" );
    else if ( RetValue == 1 )
        printf( "Networks are equivalent after fraiging.\n" );
    else if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after fraiging.\n" );
//        Abc_NtkVerifyReportErrorSeq( pNtk1, pNtk2, Fraig_ManReadModel(pMan), nFrames );
    }
    else assert( 0 );
    // delete the fraig manager
    Fraig_ManFree( pMan );
    // delete the miter
    Abc_NtkDelete( pFrames );
    return RetValue == 1;
}